

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::DeleteKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,Addr p)

{
  Addr p_00;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> C;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  
  std::__cxx11::string::string((string *)&local_a8,(string *)k);
  p_00 = FindLeafAddr(this,&local_a8,p);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((ulong)p_00 < 0xffffffff00000000) {
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    IndexNode(&local_88,this->N);
    FindNode(this,p_00,&local_88);
    std::__cxx11::string::string((string *)&bStack_c8,(string *)k);
    Delete_Aux(this,&local_88,&bStack_c8,p);
    std::__cxx11::string::~string((string *)&bStack_c8);
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~IndexNode(&local_88);
  }
  return;
}

Assistant:

void BpTree<K>::DeleteKey(K k, Addr p) {
	Addr pos = this->FindLeafAddr(k, p);
	if (pos.FileOff != -1) {
		IndexNode<K> C(N);
		this->FindNode(pos, C);
		this->Delete_Aux(C, k, p);
	}
	else
		//cout << "Cannot find the key!" << endl;
	return;
}